

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

FString __thiscall FString::operator+(FString *this,FString *tail)

{
  FString *in_RDX;
  
  FString(this,tail,in_RDX);
  return (FString)(char *)this;
}

Assistant:

FString FString::operator + (const FString &tail) const
{
	return FString (*this, tail);
}